

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O2

Frag __thiscall re2::Compiler::Plus(Compiler *this,Frag a,bool nongreedy)

{
  uint p;
  Compiler *this_00;
  Inst *this_01;
  uint uVar2;
  uint32_t out;
  Frag FVar3;
  uint uStack_48;
  uint uStack_44;
  Frag a_local;
  undefined8 uVar1;
  
  this_00 = this;
  p = AllocInst(this,1);
  if ((int)p < 0) {
    FVar3 = NoMatch(this_00);
    uVar1 = FVar3._0_8_;
    uStack_48 = FVar3.end.tail;
    uStack_44 = CONCAT31(uStack_44._1_3_,FVar3.nullable);
  }
  else {
    this_01 = (this->inst_).ptr_._M_t.
              super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
              super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
              super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl + p;
    uVar2 = p * 2;
    out = a.begin;
    if (nongreedy) {
      Prog::Inst::InitAlt(this_01,0,out);
    }
    else {
      Prog::Inst::InitAlt(this_01,out,0);
      uVar2 = uVar2 | 1;
    }
    PatchList::Patch((this->inst_).ptr_._M_t.
                     super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>
                     ._M_t.
                     super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                     .super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl,a.end,p);
    uStack_48 = uVar2 / 1;
    uStack_44 = CONCAT31(uStack_44._1_3_,a.nullable) & 0xffffff01;
    uVar1 = CONCAT44(uVar2,out);
  }
  FVar3._12_4_ = uStack_44;
  FVar3.end.tail = uStack_48;
  FVar3.begin = (int)uVar1;
  FVar3.end.head = (int)((ulong)uVar1 >> 0x20);
  return FVar3;
}

Assistant:

Frag Compiler::Plus(Frag a, bool nongreedy) {
  int id = AllocInst(1);
  if (id < 0)
    return NoMatch();
  PatchList pl;
  if (nongreedy) {
    inst_[id].InitAlt(0, a.begin);
    pl = PatchList::Mk(id << 1);
  } else {
    inst_[id].InitAlt(a.begin, 0);
    pl = PatchList::Mk((id << 1) | 1);
  }
  PatchList::Patch(inst_.data(), a.end, id);
  return Frag(a.begin, pl, a.nullable);
}